

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

ON_RenderContent * __thiscall
ON_RenderContentPrivate::FindChild(ON_RenderContentPrivate *this,wchar_t *child_slot_name)

{
  ON_RenderContent *pOVar1;
  bool bVar2;
  ON_RenderContent **ppOVar3;
  ON_wString OStack_38;
  
  std::recursive_mutex::lock(&this->m_mutex);
  ppOVar3 = &this->m_first_child;
  while (pOVar1 = *ppOVar3, pOVar1 != (ON_RenderContent *)0x0) {
    (*(pOVar1->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x3b])(&OStack_38,pOVar1);
    bVar2 = ::operator==(&OStack_38,child_slot_name);
    ON_wString::~ON_wString(&OStack_38);
    if (bVar2) break;
    ppOVar3 = &pOVar1->_private->m_next_sibling;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return pOVar1;
}

Assistant:

ON_RenderContent* ON_RenderContentPrivate::FindChild(const wchar_t* child_slot_name) const
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  ON_RenderContent* child_rc = m_first_child;
  while (nullptr != child_rc)
  {
    if (child_rc->ChildSlotName() == child_slot_name)
      return child_rc;

    child_rc = child_rc->_private->m_next_sibling;
  }

  return nullptr;
}